

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

bool __thiscall iDynTree::Model::isFrameNameUsed(Model *this,string *frameName)

{
  long lVar1;
  pointer pLVar2;
  pointer pLVar3;
  size_t sVar4;
  int iVar5;
  long lVar6;
  size_type *psVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  pLVar2 = (this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pLVar3 = (this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl
           .super__Vector_impl_data._M_start;
  lVar6 = (long)pLVar2 - (long)pLVar3 >> 4;
  uVar8 = lVar6 * 0x6db6db6db6db6db7;
  bVar10 = pLVar2 != pLVar3;
  if (bVar10) {
    sVar4 = frameName->_M_string_length;
    psVar7 = &((this->linkNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    uVar9 = 1;
    do {
      if ((sVar4 == *psVar7) &&
         ((sVar4 == 0 ||
          (iVar5 = bcmp((frameName->_M_dataplus)._M_p,
                        (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar7 + -1))->_M_dataplus)._M_p,sVar4), iVar5 == 0)))) {
        if (bVar10) {
          return true;
        }
        break;
      }
      bVar10 = uVar9 < uVar8;
      lVar1 = (lVar6 * -0x6db6db6db6db6db7 - (ulong)(uVar8 == 0)) + uVar9;
      uVar9 = uVar9 + 1;
      psVar7 = psVar7 + 4;
    } while (lVar1 != 0);
  }
  lVar6 = ((long)(this->additionalFrames).
                 super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->additionalFrames).
                 super__Vector_base<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
  uVar9 = lVar6 + uVar8;
  bVar10 = uVar8 < uVar9;
  if (bVar10) {
    sVar4 = frameName->_M_string_length;
    psVar7 = &((this->frameNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    do {
      uVar8 = uVar8 + 1;
      if (sVar4 == *psVar7) {
        if (sVar4 == 0) {
          return bVar10;
        }
        iVar5 = bcmp((frameName->_M_dataplus)._M_p,
                     (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (psVar7 + -1))->_M_dataplus)._M_p,sVar4);
        if (iVar5 == 0) {
          return bVar10;
        }
      }
      bVar10 = uVar8 < uVar9;
      psVar7 = psVar7 + 4;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  return bVar10;
}

Assistant:

bool Model::isFrameNameUsed(const std::string frameName) const
{
    for(size_t i=0; i < this->getNrOfLinks(); i++ )
    {
        if( frameName == linkNames[i] )
        {
            return true;
        }
    }

    for(size_t i=this->getNrOfLinks(); i < this->getNrOfFrames(); i++ )
    {
        if( frameName == this->frameNames[i-getNrOfLinks()] )
        {
            return true;
        }
    }

    return false;
}